

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BooPHF.h
# Opt level: O0

void * boomphf::
       thread_processLevel<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>,std::vector<unsigned_long,std::allocator<unsigned_long>>,boomphf::bfile_iterator<unsigned_long>>
                 (void *args)

{
  long *in_RDI;
  shared_ptr<boomphf::bfile_iterator<unsigned_long>_> until_p;
  shared_ptr<boomphf::bfile_iterator<unsigned_long>_> startit;
  pthread_mutex_t *mutex;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000078;
  mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_> *in_stack_00000080;
  vector<unsigned_long,_std::allocator<unsigned_long>_> buffer;
  int level;
  mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_> *obw;
  thread_args<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boomphf::bfile_iterator<unsigned_long>_>
  *targ;
  shared_ptr<boomphf::bfile_iterator<unsigned_long>_> *psVar1;
  shared_ptr<boomphf::bfile_iterator<unsigned_long>_> *this;
  shared_ptr<void> *in_stack_ffffffffffffff48;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar2;
  size_type in_stack_ffffffffffffff58;
  undefined1 local_88 [32];
  shared_ptr<boomphf::bfile_iterator<unsigned_long>_> local_68;
  pthread_mutex_t *local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  undefined4 local_24;
  long local_20;
  void *local_8;
  
  if (in_RDI == (long *)0x0) {
    local_8 = (void *)0x0;
  }
  else {
    local_20 = *in_RDI;
    local_24 = (undefined4)in_RDI[6];
    pvVar2 = &local_40;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1183c2);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (pvVar2,in_stack_ffffffffffffff58);
    local_58 = (pthread_mutex_t *)(local_20 + 0x268);
    pthread_mutex_lock(local_58);
    psVar1 = &local_68;
    std::static_pointer_cast<boomphf::bfile_iterator<unsigned_long>,void>(in_stack_ffffffffffffff48)
    ;
    this = (shared_ptr<boomphf::bfile_iterator<unsigned_long>_> *)(local_88 + 0x10);
    std::static_pointer_cast<boomphf::bfile_iterator<unsigned_long>,void>(in_stack_ffffffffffffff48)
    ;
    pthread_mutex_unlock(local_58);
    pvVar2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_88;
    std::shared_ptr<boomphf::bfile_iterator<unsigned_long>_>::shared_ptr(this,psVar1);
    std::shared_ptr<boomphf::bfile_iterator<unsigned_long>_>::shared_ptr(this,psVar1);
    mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>::
    pthread_processLevel<boomphf::bfile_iterator<unsigned_long>>
              (in_stack_00000080,in_stack_00000078,
               (shared_ptr<boomphf::bfile_iterator<unsigned_long>_> *)&mutex->__data,
               (shared_ptr<boomphf::bfile_iterator<unsigned_long>_> *)
               startit.
               super___shared_ptr<boomphf::bfile_iterator<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi,
               startit.
               super___shared_ptr<boomphf::bfile_iterator<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr._4_4_);
    std::shared_ptr<boomphf::bfile_iterator<unsigned_long>_>::~shared_ptr
              ((shared_ptr<boomphf::bfile_iterator<unsigned_long>_> *)0x118493);
    std::shared_ptr<boomphf::bfile_iterator<unsigned_long>_>::~shared_ptr
              ((shared_ptr<boomphf::bfile_iterator<unsigned_long>_> *)0x11849d);
    local_8 = (void *)0x0;
    std::shared_ptr<boomphf::bfile_iterator<unsigned_long>_>::~shared_ptr
              ((shared_ptr<boomphf::bfile_iterator<unsigned_long>_> *)0x1184b3);
    std::shared_ptr<boomphf::bfile_iterator<unsigned_long>_>::~shared_ptr
              ((shared_ptr<boomphf::bfile_iterator<unsigned_long>_> *)0x1184bd);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(pvVar2);
  }
  return local_8;
}

Assistant:

void * thread_processLevel(void * args)
	{
		if(args ==NULL) return NULL;

		thread_args<Range,it_type> *targ = (thread_args<Range,it_type>*) args;

		mphf<elem_t, Hasher_t>  * obw = (mphf<elem_t, Hasher_t > *) targ->boophf;
		int level = targ->level;
		std::vector<elem_t> buffer;
		buffer.resize(NBBUFF);
		
		pthread_mutex_t * mutex =  & obw->_mutex;

		pthread_mutex_lock(mutex); // from comment above: "//get starting iterator for this thread, must be protected (must not be currently used by other thread to copy elems in buff)"
        std::shared_ptr<it_type> startit = std::static_pointer_cast<it_type>(targ->it_p);
        std::shared_ptr<it_type> until_p = std::static_pointer_cast<it_type>(targ->until_p);
		pthread_mutex_unlock(mutex);

		obw->pthread_processLevel(buffer, startit, until_p, level);

		return NULL;
	}